

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_iter.c
# Opt level: O2

int main(void)

{
  uint insn;
  byte *pbVar1;
  size_t sVar2;
  uint64_t uVar3;
  cs_detail *pcVar4;
  _Bool _Var5;
  cs_err cVar6;
  cs_insn *insn_00;
  char *pcVar7;
  long lVar8;
  ulong uVar9;
  byte *pbVar10;
  csh handle;
  long local_50;
  size_t size;
  uint8_t *code;
  uint64_t address;
  
  lVar8 = 0;
  while (lVar8 != 0x10) {
    puts("****************");
    local_50 = lVar8;
    printf("Platform: %s\n",(&PTR_anon_var_dwarf_45_00267c28)[lVar8 * 5]);
    cVar6 = cs_open((&DAT_00267c10)[lVar8 * 10],(&DAT_00267c14)[lVar8 * 10],&handle);
    if (cVar6 == CS_ERR_OK) {
      if ((&DAT_00267c30)[lVar8 * 10] != 0) {
        cs_option(handle,(&DAT_00267c30)[lVar8 * 10],(ulong)(uint)(&DAT_00267c34)[lVar8 * 10]);
      }
      cs_option(handle,CS_OPT_DETAIL,3);
      insn_00 = cs_malloc(handle);
      pbVar1 = (&PTR_anon_var_dwarf_27_00267c18)[lVar8 * 5];
      sVar2 = (&DAT_00267c20)[lVar8 * 5];
      printf("Code: ");
      for (pbVar10 = pbVar1; pbVar10 < pbVar1 + sVar2; pbVar10 = pbVar10 + 1) {
        printf("0x%02x ",(ulong)*pbVar10);
      }
      putchar(10);
      puts("Disasm:");
      address = 0x1000;
      size = sVar2;
      code = pbVar1;
      while( true ) {
        _Var5 = cs_disasm_iter(handle,&code,&size,&address,insn_00);
        if (!_Var5) break;
        uVar3 = insn_00->address;
        insn = insn_00->id;
        pcVar7 = cs_insn_name(handle,insn);
        printf("0x%lx:\t%s\t\t%s // insn-ID: %u, insn-mnem: %s\n",uVar3,insn_00->mnemonic,
               insn_00->op_str,(ulong)insn,pcVar7);
        pcVar4 = insn_00->detail;
        if (pcVar4->regs_read_count != '\0') {
          printf("\tImplicit registers read: ");
          for (uVar9 = 0; uVar9 < pcVar4->regs_read_count; uVar9 = uVar9 + 1) {
            pcVar7 = cs_reg_name(handle,(uint)pcVar4->regs_read[uVar9]);
            printf("%s ",pcVar7);
          }
          putchar(10);
        }
        if (pcVar4->regs_write_count != '\0') {
          printf("\tImplicit registers modified: ");
          for (uVar9 = 0; uVar9 < pcVar4->regs_write_count; uVar9 = uVar9 + 1) {
            pcVar7 = cs_reg_name(handle,(uint)pcVar4->regs_write[uVar9]);
            printf("%s ",pcVar7);
          }
          putchar(10);
        }
        if (pcVar4->groups_count != '\0') {
          printf("\tThis instruction belongs to groups: ");
          for (uVar9 = 0; uVar9 < pcVar4->groups_count; uVar9 = uVar9 + 1) {
            pcVar7 = cs_group_name(handle,(uint)pcVar4->groups[uVar9]);
            printf("%s ",pcVar7);
          }
          putchar(10);
        }
      }
      putchar(10);
      cs_free(insn_00,1);
      cs_close(&handle);
    }
    else {
      printf("Failed on cs_open() with error returned: %u\n",(ulong)cVar6);
    }
    lVar8 = local_50 + 1;
  }
  return 0;
}

Assistant:

int main()
{
	test();

	return 0;
}